

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandReach(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Frame_t *pAVar1;
  Abc_Ntk_t *pAVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  Saig_ParBbr_t Pars;
  char *local_70;
  Saig_ParBbr_t local_68;
  Abc_Frame_t *local_40;
  Abc_Ntk_t *local_38;
  
  local_40 = pAbc;
  local_38 = Abc_FrameReadNtk(pAbc);
  Bbr_ManSetDefaultParams(&local_68);
  local_70 = (char *)0x0;
  Extra_UtilGetoptReset();
LAB_0020bde0:
  while (iVar3 = Extra_UtilGetopt(argc,argv,"TBFLproyvh"), pAVar2 = local_38,
        iVar5 = globalUtilOptind, iVar3 < 0x4c) {
    if (iVar3 != 0x42) {
      if (iVar3 == 0x46) {
        if (globalUtilOptind < argc) {
          uVar4 = atoi(argv[globalUtilOptind]);
          local_68.nIterMax = uVar4;
          goto LAB_0020be73;
        }
        pcVar6 = "Command line switch \"-F\" should be followed by an integer.\n";
        goto LAB_0020bf94;
      }
      if (iVar3 == -1) {
        if (local_38 == (Abc_Ntk_t *)0x0) {
          pcVar6 = "Empty network.\n";
        }
        else {
          if (local_38->nObjCounts[8] == 0) {
            Abc_Print(-1,"The current network has no latches.\n");
            return 0;
          }
          if (local_38->ntkType == ABC_NTK_STRASH) {
            iVar5 = Abc_NtkDarReach(local_38,&local_68);
            pAVar1 = local_40;
            local_40->Status = iVar5;
            local_40->nFrames = local_68.iFrame;
            Abc_FrameReplaceCex(local_40,&pAVar2->pSeqModel);
            if (local_70 == (char *)0x0) {
              return 0;
            }
            Abc_NtkWriteLogFile(local_70,pAVar1->pCex,pAVar1->Status,pAVar1->nFrames,"reach");
            return 0;
          }
          pcVar6 = "Reachability analysis works only for AIGs (run \"strash\").\n";
        }
        iVar5 = -1;
        goto LAB_0020c0e6;
      }
      goto switchD_0020be02_caseD_71;
    }
    if (argc <= globalUtilOptind) {
      pcVar6 = "Command line switch \"-B\" should be followed by an integer.\n";
      goto LAB_0020bf94;
    }
    uVar4 = atoi(argv[globalUtilOptind]);
    local_68.nBddMax = uVar4;
LAB_0020be73:
    globalUtilOptind = iVar5 + 1;
    if ((int)uVar4 < 0) {
switchD_0020be02_caseD_71:
      Abc_Print(-2,"usage: reach [-TBF num] [-L file] [-proyvh]\n");
      Abc_Print(-2,"\t         verifies sequential miter using BDD-based reachability\n");
      Abc_Print(-2,"\t-T num : approximate time limit in seconds (0=infinite) [default = %d]\n",
                (ulong)(uint)local_68.TimeLimit);
      Abc_Print(-2,"\t-B num : max number of nodes in the intermediate BDDs [default = %d]\n",
                (ulong)(uint)local_68.nBddMax);
      Abc_Print(-2,"\t-F num : max number of reachability iterations [default = %d]\n",
                (ulong)(uint)local_68.nIterMax);
      pcVar6 = "no logging";
      if (local_70 != (char *)0x0) {
        pcVar6 = local_70;
      }
      Abc_Print(-2,"\t-L file: the log file name [default = %s]\n",pcVar6);
      pcVar7 = "yes";
      pcVar6 = "yes";
      if (local_68.fPartition == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-p     : enable partitioned image computation [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_68.fReorder == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-r     : enable dynamic BDD variable reordering [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_68.fReorderImage == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,
                "\t-o     : toggles BDD variable reordering during image computation [default = %s]\n"
                ,pcVar6);
      pcVar6 = "yes";
      if (local_68.fSkipOutCheck == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-y     : skip checking property outputs [default = %s]\n",pcVar6);
      if (local_68.fVerbose == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-v     : prints verbose information [default = %s]\n",pcVar7);
      pcVar6 = "\t-h     : print the command usage\n";
      iVar5 = -2;
LAB_0020c0e6:
      Abc_Print(iVar5,pcVar6);
      return 1;
    }
  }
  switch(iVar3) {
  case 0x6f:
    local_68.fReorderImage = local_68.fReorderImage ^ 1;
    goto LAB_0020bde0;
  case 0x70:
    local_68.fPartition = local_68.fPartition ^ 1;
    goto LAB_0020bde0;
  case 0x71:
  case 0x73:
  case 0x74:
  case 0x75:
  case 0x77:
  case 0x78:
    goto switchD_0020be02_caseD_71;
  case 0x72:
    local_68.fReorder = local_68.fReorder ^ 1;
    goto LAB_0020bde0;
  case 0x76:
    local_68.fVerbose = local_68.fVerbose ^ 1;
    goto LAB_0020bde0;
  case 0x79:
    local_68.fSkipOutCheck = local_68.fSkipOutCheck ^ 1;
    goto LAB_0020bde0;
  }
  if (iVar3 == 0x4c) {
    if (globalUtilOptind < argc) {
      local_70 = argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_0020bde0;
    }
    pcVar6 = "Command line switch \"-L\" should be followed by a file name.\n";
  }
  else {
    if (iVar3 != 0x54) goto switchD_0020be02_caseD_71;
    if (globalUtilOptind < argc) {
      uVar4 = atoi(argv[globalUtilOptind]);
      local_68.TimeLimit = uVar4;
      goto LAB_0020be73;
    }
    pcVar6 = "Command line switch \"-T\" should be followed by an integer.\n";
  }
LAB_0020bf94:
  Abc_Print(-1,pcVar6);
  goto switchD_0020be02_caseD_71;
}

Assistant:

int Abc_CommandReach( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Saig_ParBbr_t Pars, * pPars = &Pars;
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    char * pLogFileName = NULL;

    extern int Abc_NtkDarReach( Abc_Ntk_t * pNtk, Saig_ParBbr_t * pPars );

    // set defaults
    Bbr_ManSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "TBFLproyvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeLimit < 0 )
                goto usage;
            break;
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBddMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBddMax < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nIterMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nIterMax < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by a file name.\n" );
                goto usage;
            }
            pLogFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'p':
            pPars->fPartition ^= 1;
            break;
        case 'r':
            pPars->fReorder ^= 1;
            break;
        case 'o':
            pPars->fReorderImage ^= 1;
            break;
        case 'y':
            pPars->fSkipOutCheck ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkLatchNum(pNtk) == 0 )
    {
        Abc_Print( -1, "The current network has no latches.\n" );
        return 0;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Reachability analysis works only for AIGs (run \"strash\").\n" );
        return 1;
    }
    pAbc->Status  = Abc_NtkDarReach( pNtk, pPars );
    pAbc->nFrames = pPars->iFrame;
    Abc_FrameReplaceCex( pAbc, &pNtk->pSeqModel );
    if ( pLogFileName )
        Abc_NtkWriteLogFile( pLogFileName, pAbc->pCex, pAbc->Status, pAbc->nFrames, "reach" );
    return 0;

usage:
    Abc_Print( -2, "usage: reach [-TBF num] [-L file] [-proyvh]\n" );
    Abc_Print( -2, "\t         verifies sequential miter using BDD-based reachability\n" );
    Abc_Print( -2, "\t-T num : approximate time limit in seconds (0=infinite) [default = %d]\n", pPars->TimeLimit );
    Abc_Print( -2, "\t-B num : max number of nodes in the intermediate BDDs [default = %d]\n", pPars->nBddMax );
    Abc_Print( -2, "\t-F num : max number of reachability iterations [default = %d]\n", pPars->nIterMax );
    Abc_Print( -2, "\t-L file: the log file name [default = %s]\n", pLogFileName ? pLogFileName : "no logging" );
    Abc_Print( -2, "\t-p     : enable partitioned image computation [default = %s]\n", pPars->fPartition? "yes": "no" );
    Abc_Print( -2, "\t-r     : enable dynamic BDD variable reordering [default = %s]\n", pPars->fReorder? "yes": "no" );
    Abc_Print( -2, "\t-o     : toggles BDD variable reordering during image computation [default = %s]\n", pPars->fReorderImage? "yes": "no" );
    Abc_Print( -2, "\t-y     : skip checking property outputs [default = %s]\n", pPars->fSkipOutCheck? "yes": "no" );
    Abc_Print( -2, "\t-v     : prints verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}